

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

bool __thiscall flatbuffers::csharp::CSharpGenerator::generate(CSharpGenerator *this)

{
  EnumDef *enum_def;
  StructDef *struct_def;
  bool bVar1;
  pointer ppEVar2;
  Parser *pPVar3;
  pointer ppSVar4;
  string enumcode;
  string one_file_code;
  
  one_file_code._M_dataplus._M_p = (pointer)&one_file_code.field_2;
  one_file_code._M_string_length = 0;
  one_file_code.field_2._M_local_buf[0] = '\0';
  pPVar3 = (this->super_BaseGenerator).parser_;
  this->cur_name_space_ = pPVar3->current_namespace_;
  for (ppEVar2 = (pPVar3->enums_).vec.
                 super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar2 !=
      (pPVar3->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar2 = ppEVar2 + 1) {
    enumcode._M_string_length = 0;
    enumcode.field_2._M_local_buf[0] = '\0';
    enum_def = *ppEVar2;
    if ((pPVar3->opts).one_file == false) {
      this->cur_name_space_ = (enum_def->super_Definition).defined_namespace;
    }
    enumcode._M_dataplus._M_p = (pointer)&enumcode.field_2;
    GenEnum(this,enum_def,&enumcode,&pPVar3->opts);
    pPVar3 = (this->super_BaseGenerator).parser_;
    if ((pPVar3->opts).one_file == true) {
      std::__cxx11::string::append((string *)&one_file_code);
    }
    else {
      bVar1 = SaveType(this,(string *)enum_def,(enum_def->super_Definition).defined_namespace,
                       &enumcode,false,&pPVar3->opts);
      if (!bVar1) goto LAB_00171580;
    }
    std::__cxx11::string::~string((string *)&enumcode);
    pPVar3 = (this->super_BaseGenerator).parser_;
  }
  for (ppSVar4 = (pPVar3->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar4 !=
      (pPVar3->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar4 = ppSVar4 + 1) {
    enumcode._M_string_length = 0;
    enumcode.field_2._M_local_buf[0] = '\0';
    struct_def = *ppSVar4;
    if ((pPVar3->opts).one_file == false) {
      this->cur_name_space_ = (struct_def->super_Definition).defined_namespace;
    }
    enumcode._M_dataplus._M_p = (pointer)&enumcode.field_2;
    GenStruct(this,struct_def,&enumcode,&pPVar3->opts);
    GenStructVerifier(this,struct_def,&enumcode);
    pPVar3 = (this->super_BaseGenerator).parser_;
    if ((pPVar3->opts).one_file == true) {
      std::__cxx11::string::append((string *)&one_file_code);
    }
    else {
      bVar1 = SaveType(this,(string *)struct_def,(struct_def->super_Definition).defined_namespace,
                       &enumcode,true,&pPVar3->opts);
      if (!bVar1) goto LAB_00171580;
    }
    std::__cxx11::string::~string((string *)&enumcode);
    pPVar3 = (this->super_BaseGenerator).parser_;
  }
  bVar1 = true;
  if ((pPVar3->opts).one_file == true) {
    bVar1 = SaveType(this,(this->super_BaseGenerator).file_name_,pPVar3->current_namespace_,
                     &one_file_code,true,&pPVar3->opts);
  }
LAB_001715c0:
  std::__cxx11::string::~string((string *)&one_file_code);
  return bVar1;
LAB_00171580:
  std::__cxx11::string::~string((string *)&enumcode);
  bVar1 = false;
  goto LAB_001715c0;
}

Assistant:

bool generate() {
    std::string one_file_code;
    cur_name_space_ = parser_.current_namespace_;

    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      std::string enumcode;
      auto &enum_def = **it;
      if (!parser_.opts.one_file) cur_name_space_ = enum_def.defined_namespace;
      GenEnum(enum_def, &enumcode, parser_.opts);
      if (parser_.opts.one_file) {
        one_file_code += enumcode;
      } else {
        if (!SaveType(enum_def.name, *enum_def.defined_namespace, enumcode,
                      false, parser_.opts))
          return false;
      }
    }

    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      std::string declcode;
      auto &struct_def = **it;
      if (!parser_.opts.one_file)
        cur_name_space_ = struct_def.defined_namespace;
      GenStruct(struct_def, &declcode, parser_.opts);
      GenStructVerifier(struct_def, &declcode);
      if (parser_.opts.one_file) {
        one_file_code += declcode;
      } else {
        if (!SaveType(struct_def.name, *struct_def.defined_namespace, declcode,
                      true, parser_.opts))
          return false;
      }
    }

    if (parser_.opts.one_file) {
      return SaveType(file_name_, *parser_.current_namespace_, one_file_code,
                      true, parser_.opts);
    }
    return true;
  }